

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.pb.cc
# Opt level: O3

void __thiscall google::protobuf::Any::Clear(Any *this)

{
  internal::ArenaStringPtr::ClearToEmpty(&(this->field_0)._impl_.type_url_);
  internal::ArenaStringPtr::ClearToEmpty(&(this->field_0)._impl_.value_);
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void Any::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.Any)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.type_url_.ClearToEmpty();
  _impl_.value_.ClearToEmpty();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}